

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesRaw
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props,TextureMap *textures,
          MeshGeometry *mesh)

{
  undefined8 uVar1;
  ulong __n;
  PropertyTable *this_00;
  aiMaterial *paVar2;
  int iVar3;
  long lVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  mapped_type *pmVar7;
  Property *pPVar8;
  __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_> _Var9;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar10;
  long *plVar11;
  MeshGeometry *this_01;
  MatIndexArray *pMVar12;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  undefined8 *puVar14;
  _Rb_tree_header *p_Var15;
  size_type *psVar16;
  uint uVar17;
  _Self __tmp;
  uint uVar18;
  size_t __n_00;
  char *pcVar19;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  int uvIndex;
  string name;
  uint matIndex;
  string prefix;
  aiUVTransform uvTrafo;
  Video *media;
  int value;
  uint local_6bc;
  aiMaterial *local_6b8;
  FBXConverter *local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  _Base_ptr local_628;
  MeshGeometry *local_620;
  undefined4 local_614;
  _Base_ptr local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  VideoMap *local_5e8;
  _Rb_tree_header *local_5e0;
  _Base_ptr local_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined4 local_5c0;
  Video *local_5b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  local_5b0 [2];
  ios_base local_540 [268];
  aiString local_434;
  
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  local_6b8 = out_mat;
  local_628 = (_Base_ptr)textures;
  local_620 = mesh;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"$raw.","");
  PropertyTable::GetUnparsedProperties_abi_cxx11_((DirectPropertyMap *)local_5b0,props);
  p_Var6 = &local_5b0[0]._M_impl.super__Rb_tree_header;
  local_6b0 = this;
  if ((_Rb_tree_header *)local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_left != p_Var6) {
    p_Var5 = local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::operator+(&local_688,&local_608,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 1));
      uVar1 = *(undefined8 *)(p_Var5 + 2);
      lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<aiVector3t<float>>::typeinfo,0
                            );
      if (lVar4 == 0) {
        lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<aiColor3D>::typeinfo,0);
        if (lVar4 == 0) {
          lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,
                                 &TypedProperty<aiColor4t<float>>::typeinfo,0);
          if (lVar4 == 0) {
            lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
            if (lVar4 == 0) {
              lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<int>::typeinfo,0);
              if (lVar4 == 0) {
                lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<bool>::typeinfo,0);
                if (lVar4 == 0) {
                  lVar4 = __dynamic_cast(uVar1,&Property::typeinfo,
                                         &TypedProperty<std::__cxx11::string>::typeinfo,0);
                  if (lVar4 != 0) {
                    __n_00 = *(ulong *)(lVar4 + 0x10) & 0xffffffff;
                    if ((*(ulong *)(lVar4 + 0x10) & 0xfffffc00) != 0) {
                      __n_00 = 0x3ff;
                    }
                    local_434.length = (ai_uint32)__n_00;
                    memcpy(local_434.data,*(void **)(lVar4 + 8),__n_00);
                    local_434.data[__n_00] = '\0';
                    aiMaterial::AddProperty(local_6b8,&local_434,local_688._M_dataplus._M_p,0,0);
                  }
                }
                else {
                  local_434.length = (ai_uint32)*(byte *)(lVar4 + 8);
                  aiMaterial::AddBinaryProperty
                            (local_6b8,&local_434,4,local_688._M_dataplus._M_p,0,0,aiPTI_Integer);
                }
              }
              else {
                aiMaterial::AddBinaryProperty
                          (local_6b8,(void *)(lVar4 + 8),4,local_688._M_dataplus._M_p,0,0,
                           aiPTI_Integer);
              }
            }
            else {
              aiMaterial::AddBinaryProperty
                        (local_6b8,(void *)(lVar4 + 8),4,local_688._M_dataplus._M_p,0,0,aiPTI_Float)
              ;
            }
          }
          else {
            aiMaterial::AddBinaryProperty
                      (local_6b8,(void *)(lVar4 + 8),0x10,local_688._M_dataplus._M_p,0,0,aiPTI_Float
                      );
          }
        }
        else {
          aiMaterial::AddBinaryProperty
                    (local_6b8,(void *)(lVar4 + 8),0xc,local_688._M_dataplus._M_p,0,0,aiPTI_Float);
        }
      }
      else {
        aiMaterial::AddBinaryProperty
                  (local_6b8,(void *)(lVar4 + 8),0xc,local_688._M_dataplus._M_p,0,0,aiPTI_Float);
      }
      this = local_6b0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_688._M_dataplus._M_p != &local_688.field_2) {
        operator_delete(local_688._M_dataplus._M_p);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var6);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::~_Rb_tree(local_5b0);
  p_Var5 = (((_Rep_type *)&local_628->_M_color)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_628 = &(((_Rep_type *)&local_628->_M_color)->_M_impl).super__Rb_tree_header._M_header;
  if (p_Var5 != local_628) {
    local_5e8 = &this->textures_converted;
    local_5e0 = &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header;
    local_610 = &(this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      std::operator+(&local_688,&local_608,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var5 + 1));
      lVar4 = *(long *)(p_Var5 + 2);
      if (lVar4 != 0) {
        local_434.length = 0;
        local_434.data[0] = '\0';
        local_5d8 = p_Var5;
        memset(local_434.data + 1,0x1b,0x3ff);
        __n = *(ulong *)(lVar4 + 0x70);
        if (__n < 0x400) {
          local_434.length = (ai_uint32)__n;
          memcpy(local_434.data,*(void **)(lVar4 + 0x68),__n);
          local_434.data[__n] = '\0';
        }
        local_5b8 = *(Video **)(lVar4 + 0xe8);
        if ((local_5b8 != (Video *)0x0) && (local_5b8->contentLength != 0)) {
          p_Var6 = local_5e0;
          for (p_Var5 = (this->textures_converted)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
              p_Var5 = (&p_Var5->_M_left)[*(Video **)(p_Var5 + 1) < local_5b8]) {
            if (*(Video **)(p_Var5 + 1) >= local_5b8) {
              p_Var6 = (_Rb_tree_header *)p_Var5;
            }
          }
          p_Var15 = local_5e0;
          if ((p_Var6 != local_5e0) &&
             (p_Var15 = p_Var6, local_5b8 < (Video *)p_Var6->_M_node_count)) {
            p_Var15 = local_5e0;
          }
          if (p_Var15 == local_5e0) {
            uVar18 = ConvertVideo(this,local_5b8);
            pmVar7 = std::
                     map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
                     ::operator[](local_5e8,&local_5b8);
            *pmVar7 = uVar18;
          }
          else {
            uVar18 = *(uint *)(p_Var15 + 1);
          }
          local_434.data[0] = '*';
          local_434.length = 1;
          if ((int)uVar18 < 0) {
            local_434.data[1] = '-';
            uVar18 = -uVar18;
            local_434.length = 2;
            pcVar19 = local_434.data + 2;
          }
          else {
            pcVar19 = local_434.data + 1;
          }
          iVar3 = 1000000000;
          bVar22 = false;
          do {
            pcVar20 = pcVar19;
            if (0x3fe < local_434.length) break;
            uVar17 = (int)uVar18 % iVar3;
            if (((bVar22) || (iVar3 == 1)) || ((int)((long)(int)uVar18 / (long)iVar3) != 0)) {
              pcVar20 = pcVar19 + 1;
              local_434.length = local_434.length + 1;
              *pcVar19 = (char)((long)(int)uVar18 / (long)iVar3) + '0';
              bVar22 = true;
              pcVar19 = pcVar20;
              uVar18 = uVar17;
              if (iVar3 != 1) goto LAB_00179d15;
              bVar21 = false;
              iVar3 = 1;
            }
            else {
LAB_00179d15:
              iVar3 = iVar3 / 10;
              bVar21 = true;
              pcVar20 = pcVar19;
            }
            pcVar19 = pcVar20;
          } while (bVar21);
          *pcVar20 = '\0';
          this = local_6b0;
        }
        paVar2 = local_6b8;
        local_5b0[0]._M_impl._0_8_ = &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,local_688._M_dataplus._M_p,
                   local_688._M_dataplus._M_p + local_688._M_string_length);
        std::__cxx11::string::append((char *)local_5b0);
        aiMaterial::AddProperty(paVar2,&local_434,(char *)local_5b0[0]._M_impl._0_8_,0x12,0);
        if ((_Base_ptr *)local_5b0[0]._M_impl._0_8_ !=
            &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5b0[0]._M_impl._0_8_);
        }
        paVar2 = local_6b8;
        local_5c0 = 0;
        uStack_5c8 = *(undefined8 *)(lVar4 + 0x40);
        local_5d0 = *(undefined8 *)(lVar4 + 0x38);
        local_5b0[0]._M_impl._0_8_ = &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,local_688._M_dataplus._M_p,
                   local_688._M_dataplus._M_p + local_688._M_string_length);
        std::__cxx11::string::append((char *)local_5b0);
        aiMaterial::AddBinaryProperty
                  (paVar2,&local_5d0,0x14,(char *)local_5b0[0]._M_impl._0_8_,0x12,0,aiPTI_Float);
        if ((_Base_ptr *)local_5b0[0]._M_impl._0_8_ !=
            &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5b0[0]._M_impl._0_8_);
        }
        local_6bc = 0;
        this_00 = *(PropertyTable **)(lVar4 + 200);
        if (this_00 == (PropertyTable *)0x0) {
          __assert_fail("props.get()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                        ,0x1f7,"const PropertyTable &Assimp::FBX::Texture::Props() const");
        }
        local_5b0[0]._M_impl._0_8_ = &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"UVSet","");
        pPVar8 = PropertyTable::Get(this_00,(string *)local_5b0);
        if ((pPVar8 == (Property *)0x0) ||
           (lVar4 = __dynamic_cast(pPVar8,&Property::typeinfo,
                                   &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar4 == 0)) {
          local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
          local_668._M_string_length = 0;
          local_668.field_2._M_local_buf[0] = '\0';
          bVar22 = false;
        }
        else {
          local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
          bVar22 = true;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_668,*(long *)(lVar4 + 8),
                     *(long *)(lVar4 + 0x10) + *(long *)(lVar4 + 8));
        }
        if ((_Base_ptr *)local_5b0[0]._M_impl._0_8_ !=
            &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5b0[0]._M_impl._0_8_);
        }
        if (((bVar22) && (iVar3 = std::__cxx11::string::compare((char *)&local_668), iVar3 != 0)) &&
           (local_668._M_string_length != 0)) {
          _Var9 = std::
                  __find_if<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,__gnu_cxx::__ops::_Iter_equals_val<aiMaterial*const>>
                            ((this->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             (this->materials).
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_finish,&local_6b8);
          local_614 = (undefined4)
                      ((ulong)((long)_Var9._M_current -
                              (long)(this->materials).
                                    super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
          local_6bc = 0xffffffff;
          if (local_620 == (MeshGeometry *)0x0) {
            p_Var5 = (this->meshes_converted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (p_Var5 != local_610) {
              do {
                if (*(long *)(p_Var5 + 1) == 0) {
                  this_01 = (MeshGeometry *)0x0;
                }
                else {
                  this_01 = (MeshGeometry *)
                            __dynamic_cast(*(long *)(p_Var5 + 1),&Geometry::typeinfo,
                                           &MeshGeometry::typeinfo,0);
                }
                uVar18 = local_6bc;
                if (this_01 != (MeshGeometry *)0x0) {
                  pMVar12 = MeshGeometry::GetMaterialIndices(this_01);
                  _Var13 = std::
                           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                     ((pMVar12->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start,
                                      (pMVar12->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish,&local_614);
                  uVar18 = local_6bc;
                  if (_Var13._M_current !=
                      (pMVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
                    uVar18 = 0xffffffff;
                    uVar17 = 0;
                    do {
                      pvVar10 = MeshGeometry::GetTextureCoords(this_01,uVar17);
                      if ((pvVar10->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start ==
                          (pvVar10->
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
                      MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                                ((string *)local_5b0,this_01,uVar17);
                      if (local_5b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ ==
                          local_668._M_string_length) {
                        if (local_5b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
                          bVar22 = true;
                        }
                        else {
                          iVar3 = bcmp((void *)local_5b0[0]._M_impl._0_8_,local_668._M_dataplus._M_p
                                       ,local_5b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_);
                          bVar22 = iVar3 == 0;
                        }
                      }
                      else {
                        bVar22 = false;
                      }
                      if (bVar22) {
                        uVar18 = uVar17;
                      }
                      if ((_Base_ptr *)local_5b0[0]._M_impl._0_8_ !=
                          &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
                        operator_delete((void *)local_5b0[0]._M_impl._0_8_);
                      }
                      bVar21 = uVar17 < 7;
                      uVar17 = uVar17 + 1;
                    } while (bVar21 && !bVar22);
                    if (uVar18 == 0xffffffff) {
                      std::operator+(&local_648,"did not find UV channel named ",&local_668);
                      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_648);
                      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
                      psVar16 = puVar14 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar14 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar16) {
                        local_6a8.field_2._M_allocated_capacity = *psVar16;
                        local_6a8.field_2._8_8_ = puVar14[3];
                      }
                      else {
                        local_6a8.field_2._M_allocated_capacity = *psVar16;
                        local_6a8._M_dataplus._M_p = (pointer)*puVar14;
                      }
                      local_6a8._M_string_length = puVar14[1];
                      *puVar14 = psVar16;
                      puVar14[1] = 0;
                      *(undefined1 *)(puVar14 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5b0,&local_6a8);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    }
                    else {
                      if (local_6bc == 0xffffffff) goto LAB_0017a317;
                      std::operator+(&local_648,"the UV channel named ",&local_668);
                      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_648);
                      local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
                      psVar16 = puVar14 + 2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar14 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar16) {
                        local_6a8.field_2._M_allocated_capacity = *psVar16;
                        local_6a8.field_2._8_8_ = puVar14[3];
                      }
                      else {
                        local_6a8.field_2._M_allocated_capacity = *psVar16;
                        local_6a8._M_dataplus._M_p = (pointer)*puVar14;
                      }
                      local_6a8._M_string_length = puVar14[1];
                      *puVar14 = psVar16;
                      puVar14[1] = 0;
                      *(undefined1 *)(puVar14 + 2) = 0;
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_5b0,&local_6a8);
                      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
                    std::ios_base::~ios_base(local_540);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
                      operator_delete(local_6a8._M_dataplus._M_p);
                    }
                    uVar18 = local_6bc;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_648._M_dataplus._M_p != &local_648.field_2) {
                      operator_delete(local_648._M_dataplus._M_p);
                      uVar18 = local_6bc;
                    }
                  }
                }
LAB_0017a317:
                local_6bc = uVar18;
                p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
              } while (p_Var5 != local_610);
            }
          }
          else {
            uVar17 = 0xffffffff;
            uVar18 = 0;
            do {
              pvVar10 = MeshGeometry::GetTextureCoords(local_620,uVar18);
              if ((pvVar10->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start ==
                  (pvVar10->
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish) break;
              MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
                        ((string *)local_5b0,local_620,uVar18);
              if (local_5b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ ==
                  local_668._M_string_length) {
                if (local_5b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_ == 0) {
                  bVar22 = true;
                }
                else {
                  iVar3 = bcmp((void *)local_5b0[0]._M_impl._0_8_,local_668._M_dataplus._M_p,
                               local_5b0[0]._M_impl.super__Rb_tree_header._M_header._0_8_);
                  bVar22 = iVar3 == 0;
                }
              }
              else {
                bVar22 = false;
              }
              if (bVar22) {
                uVar17 = uVar18;
              }
              if ((_Base_ptr *)local_5b0[0]._M_impl._0_8_ !=
                  &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)local_5b0[0]._M_impl._0_8_);
              }
              bVar21 = uVar18 < 7;
              uVar18 = uVar18 + 1;
            } while (bVar21 && !bVar22);
            if (uVar17 == 0xffffffff) {
              std::operator+(&local_648,"did not find UV channel named ",&local_668);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_648);
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_6a8.field_2._M_allocated_capacity = *psVar16;
                local_6a8.field_2._8_8_ = plVar11[3];
                local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
              }
              else {
                local_6a8.field_2._M_allocated_capacity = *psVar16;
                local_6a8._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_6a8._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>
                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_5b0,&local_6a8);
              LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
              std::ios_base::~ios_base(local_540);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
                operator_delete(local_6a8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_648._M_dataplus._M_p != &local_648.field_2) {
                operator_delete(local_648._M_dataplus._M_p);
              }
            }
            if (local_6bc == 0xffffffff) {
              local_6bc = uVar17;
            }
          }
          this = local_6b0;
          if (local_6bc == 0xffffffff) {
            std::operator+(&local_648,"failed to resolve UV channel ",&local_668);
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_648);
            psVar16 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_6a8.field_2._M_allocated_capacity = *psVar16;
              local_6a8.field_2._8_8_ = puVar14[3];
              local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
            }
            else {
              local_6a8.field_2._M_allocated_capacity = *psVar16;
              local_6a8._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_6a8._M_string_length = puVar14[1];
            *puVar14 = psVar16;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       local_5b0,&local_6a8);
            LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_5b0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
            std::ios_base::~ios_base(local_540);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
              operator_delete(local_6a8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_648._M_dataplus._M_p != &local_648.field_2) {
              operator_delete(local_648._M_dataplus._M_p);
            }
            local_6bc = 0;
          }
        }
        paVar2 = local_6b8;
        local_5b0[0]._M_impl._0_8_ = &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent
        ;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5b0,local_688._M_dataplus._M_p,
                   local_688._M_dataplus._M_p + local_688._M_string_length);
        std::__cxx11::string::append((char *)local_5b0);
        aiMaterial::AddBinaryProperty
                  (paVar2,&local_6bc,4,(char *)local_5b0[0]._M_impl._0_8_,0x12,0,aiPTI_Integer);
        p_Var5 = local_5d8;
        if ((_Base_ptr *)local_5b0[0]._M_impl._0_8_ !=
            &local_5b0[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_5b0[0]._M_impl._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_668._M_dataplus._M_p != &local_668.field_2) {
          operator_delete(local_668._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_688._M_dataplus._M_p != &local_688.field_2) {
        operator_delete(local_688._M_dataplus._M_p);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_628);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesRaw(aiMaterial* out_mat, const PropertyTable& props, const TextureMap& textures, const MeshGeometry* const mesh)
{
    // Add all the unparsed properties with a "$raw." prefix

    const std::string prefix = "$raw.";

    for (const DirectPropertyMap::value_type& prop : props.GetUnparsedProperties()) {

        std::string name = prefix + prop.first;

        if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor3D>* interpreted = prop.second->As<TypedProperty<aiColor3D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<aiColor4D>* interpreted = prop.second->As<TypedProperty<aiColor4D> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >())
        {
            out_mat->AddProperty(&interpreted->Value(), 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >())
        {
            int value = interpreted->Value() ? 1 : 0;
            out_mat->AddProperty(&value, 1, name.c_str(), 0, 0);
        }
        else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >())
        {
            const aiString value = aiString(interpreted->Value());
            out_mat->AddProperty(&value, name.c_str(), 0, 0);
        }
    }

    // Add the textures' properties

    for (TextureMap::const_iterator it = textures.begin(); it != textures.end(); it++) {

        std::string name = prefix + it->first;

        const Texture* const tex = (*it).second;
        if (tex != nullptr)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr && media->ContentLength() > 0) {
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                }
                else {
                    index = ConvertVideo(*media);
                    textures_converted[media] = index;
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
                path.data[0] = '*';
                path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
            }

            out_mat->AddProperty(&path, (name + "|file").c_str(), aiTextureType_UNKNOWN, 0);

            aiUVTransform uvTrafo;
            // XXX handle all kinds of UV transformations
            uvTrafo.mScaling = tex->UVScaling();
            uvTrafo.mTranslation = tex->UVTranslation();
            out_mat->AddProperty(&uvTrafo, 1, (name + "|uvtrafo").c_str(), aiTextureType_UNKNOWN, 0);
 
            int uvIndex = 0;

            bool uvFound = false;
            const std::string& uvSet = PropertyGet<std::string>(tex->Props(), "UVSet", uvFound);
            if (uvFound) {
                // "default" is the name which usually appears in the FbxFileTexture template
                if (uvSet != "default" && uvSet.length()) {
                    // this is a bit awkward - we need to find a mesh that uses this
                    // material and scan its UV channels for the given UV name because
                    // assimp references UV channels by index, not by name.

                    // XXX: the case that UV channels may appear in different orders
                    // in meshes is unhandled. A possible solution would be to sort
                    // the UV channels alphabetically, but this would have the side
                    // effect that the primary (first) UV channel would sometimes
                    // be moved, causing trouble when users read only the first
                    // UV channel and ignore UV channel assignments altogether.

                    std::vector<aiMaterial*>::iterator materialIt = std::find(materials.begin(), materials.end(), out_mat);
                    const unsigned int matIndex = static_cast<unsigned int>(std::distance(materials.begin(), materialIt));

                    uvIndex = -1;
                    if (!mesh)
                    {
                        for (const MeshMap::value_type& v : meshes_converted) {
                            const MeshGeometry* const meshGeom = dynamic_cast<const MeshGeometry*>(v.first);
                            if (!meshGeom) {
                                continue;
                            }

                            const MatIndexArray& mats = meshGeom->GetMaterialIndices();
                            if (std::find(mats.begin(), mats.end(), matIndex) == mats.end()) {
                                continue;
                            }

                            int index = -1;
                            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                                if (meshGeom->GetTextureCoords(i).empty()) {
                                    break;
                                }
                                const std::string& name = meshGeom->GetTextureCoordChannelName(i);
                                if (name == uvSet) {
                                    index = static_cast<int>(i);
                                    break;
                                }
                            }
                            if (index == -1) {
                                FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                                continue;
                            }

                            if (uvIndex == -1) {
                                uvIndex = index;
                            }
                            else {
                                FBXImporter::LogWarn("the UV channel named " + uvSet + " appears at different positions in meshes, results will be wrong");
                            }
                        }
                    }
                    else
                    {
                        int index = -1;
                        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                            if (mesh->GetTextureCoords(i).empty()) {
                                break;
                            }
                            const std::string& name = mesh->GetTextureCoordChannelName(i);
                            if (name == uvSet) {
                                index = static_cast<int>(i);
                                break;
                            }
                        }
                        if (index == -1) {
                            FBXImporter::LogWarn("did not find UV channel named " + uvSet + " in a mesh using this material");
                        }

                        if (uvIndex == -1) {
                            uvIndex = index;
                        }
                    }

                    if (uvIndex == -1) {
                        FBXImporter::LogWarn("failed to resolve UV channel " + uvSet + ", using first UV channel");
                        uvIndex = 0;
                    }
                }
            }

            out_mat->AddProperty(&uvIndex, 1, (name + "|uvwsrc").c_str(), aiTextureType_UNKNOWN, 0);
        }
            }
        }